

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O3

void Dtc_ManComputeCuts(Gia_Man_t *p,Vec_Int_t **pvCutsXor2,Vec_Int_t **pvCutsXor,
                       Vec_Int_t **pvCutsMaj,int fVerbose)

{
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  undefined8 uVar3;
  Vec_Int_t *vCuts;
  int *piVar4;
  Vec_Int_t *vCutsXor2;
  Vec_Int_t *vCutsXor;
  Vec_Int_t *vCutsMaj;
  Vec_Int_t *p_00;
  Vec_Int_t *pVVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  size_t __size;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  double dVar15;
  int **local_70;
  
  vCuts = (Vec_Int_t *)malloc(0x10);
  vCuts->nCap = 1000;
  vCuts->nSize = 0;
  piVar4 = (int *)malloc(4000);
  vCuts->pArray = piVar4;
  uVar7 = p->nObjs;
  uVar13 = ~(p->vCos->nSize + p->vCis->nSize);
  iVar12 = uVar7 + uVar13;
  vCutsXor2 = (Vec_Int_t *)malloc(0x10);
  iVar9 = 0x10;
  if (0xe < (uVar7 + uVar13) - 1) {
    iVar9 = iVar12;
  }
  vCutsXor2->nSize = 0;
  vCutsXor2->nCap = iVar9;
  lVar14 = (long)iVar9;
  if (iVar9 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc(lVar14 * 4);
  }
  vCutsXor2->pArray = piVar4;
  vCutsXor = (Vec_Int_t *)malloc(0x10);
  vCutsXor->nSize = 0;
  vCutsXor->nCap = iVar9;
  if (iVar9 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc(lVar14 * 4);
  }
  vCutsXor->pArray = piVar4;
  vCutsMaj = (Vec_Int_t *)malloc(0x10);
  vCutsMaj->nSize = 0;
  vCutsMaj->nCap = iVar9;
  if (iVar9 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc(lVar14 << 2);
  }
  vCutsMaj->pArray = piVar4;
  iVar12 = iVar12 * 0x1e;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar9 = 0x10;
  if (0xe < iVar12 - 1U) {
    iVar9 = iVar12;
  }
  p_00->nCap = iVar9;
  if (iVar9 == 0) {
    p_00->pArray = (int *)0x0;
    if ((int)uVar7 < 1) goto LAB_0067936f;
    __size = (ulong)uVar7 * 4;
LAB_0067933c:
    piVar4 = (int *)malloc(__size);
LAB_00679344:
    local_70 = &p_00->pArray;
    *local_70 = piVar4;
    if (piVar4 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    p_00->nCap = uVar7;
  }
  else {
    piVar4 = (int *)malloc((long)iVar9 << 2);
    p_00->pArray = piVar4;
    if (iVar9 < (int)uVar7) {
      __size = (long)(int)uVar7 << 2;
      if (piVar4 == (int *)0x0) goto LAB_0067933c;
      piVar4 = (int *)realloc(piVar4,__size);
      goto LAB_00679344;
    }
  }
  if (0 < (int)uVar7) {
    memset(piVar4,0,(ulong)uVar7 * 4);
  }
LAB_0067936f:
  local_70 = &p_00->pArray;
  p_00->nSize = uVar7;
  Gia_ManCleanValue(p);
  pVVar5 = p->vCis;
  if (0 < pVVar5->nSize) {
    lVar14 = 0;
    do {
      iVar12 = pVVar5->pArray[lVar14];
      lVar6 = (long)iVar12;
      if ((lVar6 < 0) || (p->nObjs <= iVar12)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if (p_00->nSize <= iVar12) goto LAB_006796b9;
      pGVar1 = p->pObjs + lVar6;
      p_00->pArray[lVar6] = p_00->nSize;
      Vec_IntPush(p_00,1);
      Vec_IntPush(p_00,1);
      pGVar2 = p->pObjs;
      if ((pGVar1 < pGVar2) || (pGVar2 + p->nObjs <= pGVar1)) {
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00,(int)((ulong)((long)pGVar1 - (long)pGVar2) >> 2) * -0x55555555);
      lVar14 = lVar14 + 1;
      pVVar5 = p->vCis;
    } while (lVar14 < pVVar5->nSize);
  }
  iVar12 = p->nObjs;
  if (iVar12 < 1) {
    uVar11 = 0;
  }
  else {
    uVar10 = 0;
    uVar11 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      uVar3 = *(undefined8 *)(p->pObjs + uVar10);
      uVar7 = (uint)uVar3;
      if ((~uVar7 & 0x1fffffff) != 0 && -1 < (int)uVar7) {
        iVar12 = (int)uVar10;
        uVar7 = iVar12 - (uVar7 & 0x1fffffff);
        if ((int)uVar7 < 0) {
LAB_0067969a:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar13 = p_00->nSize;
        if ((int)uVar13 <= (int)uVar7) goto LAB_0067969a;
        piVar4 = *local_70;
        uVar7 = piVar4[uVar7];
        if (((long)(int)uVar7 < 0) || (uVar13 <= uVar7)) {
LAB_006796d8:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        uVar8 = iVar12 - ((uint)((ulong)uVar3 >> 0x20) & 0x1fffffff);
        if (((int)uVar8 < 0) || (uVar13 <= uVar8)) goto LAB_0067969a;
        uVar8 = piVar4[uVar8];
        if (((long)(int)uVar8 < 0) || (uVar13 <= uVar8)) goto LAB_006796d8;
        Dtc_ManCutMerge(p,iVar12,piVar4 + (int)uVar7,piVar4 + (int)uVar8,vCuts,vCutsXor2,vCutsXor,
                        vCutsMaj);
        if (uVar13 <= uVar10) {
LAB_006796b9:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        piVar4[uVar10] = uVar13;
        iVar12 = vCuts->nSize;
        if ((long)iVar12 < 1) goto LAB_0067969a;
        piVar4 = vCuts->pArray;
        lVar14 = 0;
        do {
          Vec_IntPush(p_00,piVar4[lVar14]);
          lVar14 = lVar14 + 1;
        } while (iVar12 != lVar14);
        uVar11 = (ulong)(uint)((int)uVar11 + *piVar4);
        iVar12 = p->nObjs;
      }
      uVar10 = uVar10 + 1;
    } while ((long)uVar10 < (long)iVar12);
  }
  if (fVerbose != 0) {
    uVar7 = iVar12 + ~(p->vCos->nSize + p->vCis->nSize);
    dVar15 = (double)(int)uVar7;
    printf("Nodes = %d.  Cuts = %d.  Cuts/Node = %.2f.  Ints/Node = %.2f.\n",
           (double)(int)uVar11 / dVar15,(double)p_00->nSize / dVar15,(ulong)uVar7,uVar11);
  }
  if (vCuts->pArray != (int *)0x0) {
    free(vCuts->pArray);
  }
  free(vCuts);
  if (*local_70 != (int *)0x0) {
    free(*local_70);
  }
  free(p_00);
  if (pvCutsXor2 == (Vec_Int_t **)0x0) {
    if (vCutsXor2->pArray != (int *)0x0) {
      free(vCutsXor2->pArray);
    }
    free(vCutsXor2);
  }
  else {
    *pvCutsXor2 = vCutsXor2;
  }
  *pvCutsXor = vCutsXor;
  *pvCutsMaj = vCutsMaj;
  return;
}

Assistant:

void Dtc_ManComputeCuts( Gia_Man_t * p, Vec_Int_t ** pvCutsXor2, Vec_Int_t ** pvCutsXor, Vec_Int_t ** pvCutsMaj, int fVerbose )
{
    Gia_Obj_t * pObj; 
    int * pList0, * pList1, i, nCuts = 0;
    Vec_Int_t * vTemp = Vec_IntAlloc( 1000 );
    Vec_Int_t * vCutsXor2 = Vec_IntAlloc( Gia_ManAndNum(p) );
    Vec_Int_t * vCutsXor = Vec_IntAlloc( Gia_ManAndNum(p) );
    Vec_Int_t * vCutsMaj = Vec_IntAlloc( Gia_ManAndNum(p) );
    Vec_Int_t * vCuts = Vec_IntAlloc( 30 * Gia_ManAndNum(p) );
    Vec_IntFill( vCuts, Gia_ManObjNum(p), 0 );
    Gia_ManCleanValue( p );
    Gia_ManForEachCi( p, pObj, i )
    {
        Vec_IntWriteEntry( vCuts, Gia_ObjId(p, pObj), Vec_IntSize(vCuts) );
        Vec_IntPush( vCuts, 1 );
        Vec_IntPush( vCuts, 1 );
        Vec_IntPush( vCuts, Gia_ObjId(p, pObj) );
    }
    Gia_ManForEachAnd( p, pObj, i )
    {
        pList0 = Vec_IntEntryP( vCuts, Vec_IntEntry(vCuts, Gia_ObjFaninId0(pObj, i)) );
        pList1 = Vec_IntEntryP( vCuts, Vec_IntEntry(vCuts, Gia_ObjFaninId1(pObj, i)) );
        Dtc_ManCutMerge( p, i, pList0, pList1, vTemp, vCutsXor2, vCutsXor, vCutsMaj );
        Vec_IntWriteEntry( vCuts, i, Vec_IntSize(vCuts) );
        Vec_IntAppend( vCuts, vTemp );
        nCuts += Vec_IntEntry( vTemp, 0 );
    }
    if ( fVerbose )
        printf( "Nodes = %d.  Cuts = %d.  Cuts/Node = %.2f.  Ints/Node = %.2f.\n", 
            Gia_ManAndNum(p), nCuts, 1.0*nCuts/Gia_ManAndNum(p), 1.0*Vec_IntSize(vCuts)/Gia_ManAndNum(p) );
    Vec_IntFree( vTemp );
    Vec_IntFree( vCuts );
    if ( pvCutsXor2 )
        *pvCutsXor2 = vCutsXor2;
    else
        Vec_IntFree( vCutsXor2 );
    *pvCutsXor = vCutsXor;
    *pvCutsMaj = vCutsMaj;
}